

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void __thiscall APlayerPawn::Die(APlayerPawn *this,AActor *source,AActor *inflictor,int dmgflags)

{
  byte *pbVar1;
  int iVar2;
  player_t *ppVar3;
  AWeapon *this_00;
  FState *pFVar4;
  bool bVar5;
  undefined8 in_RAX;
  DDropItem *pDVar6;
  PClassActor *pPVar7;
  AInventory *pAVar8;
  AAmmo *pAVar9;
  undefined8 local_28;
  
  local_28 = in_RAX;
  AActor::Die(&this->super_AActor,source,inflictor,dmgflags);
  ppVar3 = (this->super_AActor).player;
  if (ppVar3 != (player_t *)0x0) {
    if (ppVar3->mo != this) {
      AActor::CallDie(&ppVar3->mo->super_AActor,source,inflictor,dmgflags);
      return;
    }
    ppVar3->bonuscount = 0;
    if ((((byte)dmflags2.Value & 2) != 0) &&
       (this_00 = ppVar3->ReadyWeapon, this_00 != (AWeapon *)0x0)) {
      pDVar6 = AActor::GetDropItems((AActor *)this_00);
      if (pDVar6 == (DDropItem *)0x0) {
        pFVar4 = (this_00->super_AStateProvider).super_AInventory.super_AActor.SpawnState;
        if ((pFVar4 == (FState *)0x0) ||
           (pFVar4 == *(FState **)((AActor::RegistrationInfo.MyClass)->Defaults + 0x448))) {
          pAVar8 = P_DropItem(&this->super_AActor,(PClassActor *)this_00->AmmoType1,-1,0x100);
          if (pAVar8 != (AInventory *)0x0) {
            pAVar9 = GC::ReadBarrier<AAmmo>((AAmmo **)&this_00->Ammo1);
            pAVar8->Amount = (pAVar9->super_AInventory).Amount;
            pbVar1 = (byte *)((long)&pAVar8->ItemFlags + 1);
            *pbVar1 = *pbVar1 | 0x40;
          }
          pAVar8 = P_DropItem(&this->super_AActor,(PClassActor *)this_00->AmmoType2,-1,0x100);
          if (pAVar8 == (AInventory *)0x0) goto LAB_00463e52;
          pAVar9 = GC::ReadBarrier<AAmmo>((AAmmo **)&this_00->Ammo2);
          pAVar8->Amount = (pAVar9->super_AInventory).Amount;
        }
        else {
          pPVar7 = (PClassActor *)DObject::GetClass((DObject *)this_00);
          pAVar8 = P_DropItem(&this->super_AActor,pPVar7,-1,0x100);
          if ((pAVar8 == (AInventory *)0x0) ||
             (bVar5 = DObject::IsKindOf((DObject *)pAVar8,AWeapon::RegistrationInfo.MyClass), !bVar5
             )) goto LAB_00463e52;
          if (this_00->AmmoGive1 != 0) {
            pAVar9 = GC::ReadBarrier<AAmmo>((AAmmo **)&this_00->Ammo1);
            if (pAVar9 != (AAmmo *)0x0) {
              pAVar9 = GC::ReadBarrier<AAmmo>((AAmmo **)&this_00->Ammo1);
              *(int *)&pAVar8[1].super_AActor.super_DThinker.super_DObject.ObjNext =
                   (pAVar9->super_AInventory).Amount;
            }
          }
          if (this_00->AmmoGive2 != 0) {
            pAVar9 = GC::ReadBarrier<AAmmo>((AAmmo **)&this_00->Ammo2);
            if (pAVar9 != (AAmmo *)0x0) {
              pAVar9 = GC::ReadBarrier<AAmmo>((AAmmo **)&this_00->Ammo2);
              *(int *)((long)&pAVar8[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) =
                   (pAVar9->super_AInventory).Amount;
            }
          }
        }
        pbVar1 = (byte *)((long)&pAVar8->ItemFlags + 1);
        *pbVar1 = *pbVar1 | 0x40;
      }
      else {
        for (; pDVar6 != (DDropItem *)0x0; pDVar6 = pDVar6->Next) {
          iVar2 = (pDVar6->Name).Index;
          if (iVar2 != 0) {
            local_28 = CONCAT44(local_28._4_4_,iVar2);
            pPVar7 = PClass::FindActor((FName *)&local_28);
            if (pPVar7 != (PClassActor *)0x0) {
              P_DropItem(&((this->super_AActor).player)->mo->super_AActor,pPVar7,pDVar6->Amount,
                         pDVar6->Probability);
            }
          }
        }
      }
    }
  }
LAB_00463e52:
  if ((multiplayer == false) && (iVar2 = ((level.info)->deathsequence).Index, iVar2 != 0)) {
    local_28 = CONCAT44(iVar2,local_28._0_4_);
    F_StartIntermission((FName *)((long)&local_28 + 4),'\0');
  }
  return;
}

Assistant:

void APlayerPawn::Die (AActor *source, AActor *inflictor, int dmgflags)
{
	Super::Die (source, inflictor, dmgflags);

	if (player != NULL && player->mo == this) player->bonuscount = 0;

	if (player != NULL && player->mo != this)
	{ // Make the real player die, too
		player->mo->CallDie (source, inflictor, dmgflags);
	}
	else
	{
		if (player != NULL && (dmflags2 & DF2_YES_WEAPONDROP))
		{ // Voodoo dolls don't drop weapons
			AWeapon *weap = player->ReadyWeapon;
			if (weap != NULL)
			{
				AInventory *item;

				// kgDROP - start - modified copy from a_action.cpp
				DDropItem *di = weap->GetDropItems();

				if (di != NULL)
				{
					while (di != NULL)
					{
						if (di->Name != NAME_None)
						{
							PClassActor *ti = PClass::FindActor(di->Name);
							if (ti) P_DropItem (player->mo, ti, di->Amount, di->Probability);
						}
						di = di->Next;
					}
				} else
				// kgDROP - end
				if (weap->SpawnState != NULL &&
					weap->SpawnState != ::GetDefault<AActor>()->SpawnState)
				{
					item = P_DropItem (this, weap->GetClass(), -1, 256);
					if (item != NULL && item->IsKindOf(RUNTIME_CLASS(AWeapon)))
					{
						if (weap->AmmoGive1 && weap->Ammo1)
						{
							static_cast<AWeapon *>(item)->AmmoGive1 = weap->Ammo1->Amount;
						}
						if (weap->AmmoGive2 && weap->Ammo2)
						{
							static_cast<AWeapon *>(item)->AmmoGive2 = weap->Ammo2->Amount;
						}
						item->ItemFlags |= IF_IGNORESKILL;
					}
				}
				else
				{
					item = P_DropItem (this, weap->AmmoType1, -1, 256);
					if (item != NULL)
					{
						item->Amount = weap->Ammo1->Amount;
						item->ItemFlags |= IF_IGNORESKILL;
					}
					item = P_DropItem (this, weap->AmmoType2, -1, 256);
					if (item != NULL)
					{
						item->Amount = weap->Ammo2->Amount;
						item->ItemFlags |= IF_IGNORESKILL;
					}
				}
			}
		}
		if (!multiplayer && level.info->deathsequence != NAME_None)
		{
			F_StartIntermission(level.info->deathsequence, FSTATE_EndingGame);
		}
	}
}